

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O3

HaI32 dgConvexHull3d::ConvexCompareVertex(dgHullVertex *A,dgHullVertex *B,void *context)

{
  double dVar1;
  double *pdVar2;
  int i;
  
  i = 0;
  while( true ) {
    pdVar2 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)A,i);
    dVar1 = *pdVar2;
    pdVar2 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)B,i);
    if (dVar1 < *pdVar2) {
      return -1;
    }
    pdVar2 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)A,i);
    dVar1 = *pdVar2;
    pdVar2 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)B,i);
    if (*pdVar2 < dVar1) break;
    i = i + 1;
    if (i == 3) {
      return 0;
    }
  }
  return 1;
}

Assistant:

hacd::HaI32 dgConvexHull3d::ConvexCompareVertex(const dgHullVertex* const  A, const dgHullVertex* const B, void* const context)
{
	HACD_FORCE_PARAMETER_REFERENCE(context);
	for (hacd::HaI32 i = 0; i < 3; i ++) {
		if ((*A)[i] < (*B)[i]) {
			return -1;
		} else if ((*A)[i] > (*B)[i]) {
			return 1;
		}
	}
	return 0;
}